

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cxx
# Opt level: O0

bool save_file(part *p)

{
  _Ios_Openmode __mode;
  ulong uVar1;
  ostringstream *poVar2;
  int *piVar3;
  ofstream local_790 [8];
  ofstream out;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_590 [32];
  logger local_570;
  path local_3e8;
  undefined1 local_3c0 [8];
  wstring wfn;
  logger local_3a0;
  clask local_218 [32];
  undefined1 local_1f8 [8];
  path fn;
  logger local_1c0;
  undefined1 local_38 [8];
  string filename;
  part *p_local;
  
  filename.field_2._8_8_ = p;
  clask::_part::filename_abi_cxx11_((string *)local_38,p);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) != 0) {
    clask::logger::logger(&local_1c0);
    poVar2 = clask::logger::get_abi_cxx11_(&local_1c0,ERR);
    std::operator<<((ostream *)poVar2,"filename is not provided");
    clask::logger::~logger(&local_1c0);
    p_local._7_1_ = false;
    fn._M_cmpts = (_List)0x1;
    fn._33_3_ = 0;
    goto LAB_0010cfcc;
  }
  clask::to_wstring(local_218,(string *)local_38);
  std::filesystem::__cxx11::path::path<std::__cxx11::wstring,std::filesystem::__cxx11::path>
            ((path *)local_1f8,
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_218
             ,auto_format);
  std::__cxx11::wstring::~wstring((wstring *)local_218);
  uVar1 = std::filesystem::__cxx11::path::has_filename();
  if ((uVar1 & 1) == 0) {
    clask::logger::logger(&local_3a0);
    poVar2 = clask::logger::get_abi_cxx11_(&local_3a0,ERR);
    std::operator<<((ostream *)poVar2,"filename is not provided");
    clask::logger::~logger(&local_3a0);
    p_local._7_1_ = false;
    fn._M_cmpts = (_List)0x1;
    fn._33_3_ = 0;
  }
  else {
    std::filesystem::__cxx11::path::filename(&local_3e8,(path *)local_1f8);
    std::filesystem::__cxx11::path::wstring((path *)local_3c0);
    std::filesystem::__cxx11::path::~path(&local_3e8);
    uVar1 = std::__cxx11::wstring::empty();
    if ((uVar1 & 1) == 0) {
      piVar3 = (int *)std::__cxx11::wstring::operator[]((ulong)local_3c0);
      if (*piVar3 == 0x2e) goto LAB_0010cdf8;
      std::operator+((wchar_t *)local_590,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     L"files/");
      std::filesystem::__cxx11::path::operator=((path *)local_1f8,local_590);
      std::__cxx11::wstring::~wstring((wstring *)local_590);
      __mode = std::operator|(_S_out,_S_bin);
      std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
                (local_790,(path *)local_1f8,__mode);
      std::operator<<((ostream *)local_790,(string *)&p->body);
      std::ofstream::close();
      p_local._7_1_ = true;
      fn._M_cmpts = (_List)0x1;
      fn._33_3_ = 0;
      std::ofstream::~ofstream(local_790);
    }
    else {
LAB_0010cdf8:
      clask::logger::logger(&local_570);
      poVar2 = clask::logger::get_abi_cxx11_(&local_570,ERR);
      std::operator<<((ostream *)poVar2,"filename is not provided");
      clask::logger::~logger(&local_570);
      p_local._7_1_ = false;
      fn._M_cmpts = (_List)0x1;
      fn._33_3_ = 0;
    }
    std::__cxx11::wstring::~wstring((wstring *)local_3c0);
  }
  std::filesystem::__cxx11::path::~path((path *)local_1f8);
LAB_0010cfcc:
  std::__cxx11::string::~string((string *)local_38);
  return p_local._7_1_;
}

Assistant:

static bool save_file(clask::part p) {
  auto filename = p.filename();
  if (filename.empty()) {
    clask::logger().get(clask::log_level::ERR) << "filename is not provided";
    return false;
  }
  std::filesystem::path fn(clask::to_wstring(filename));
  if (!fn.has_filename()) {
    clask::logger().get(clask::log_level::ERR) << "filename is not provided";
    return false;
  }
  std::wstring wfn = fn.filename().wstring();
  if (wfn.empty() || wfn[0] == '.') {
    clask::logger().get(clask::log_level::ERR) << "filename is not provided";
    return false;
  }
  fn = L"files/" + wfn;
  std::ofstream out(fn, std::ios::out | std::ios::binary);
  out << p.body;
  out.close();
  return true;
}